

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

int biomesToImage(uchar *pixels,uchar (*biomeColors) [3],int *biomes,uint sx,uint sy,uint pixscale,
                 int flip)

{
  int iVar1;
  uint uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  uchar uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uchar uVar10;
  uint uVar11;
  uchar uVar12;
  int local_54;
  
  local_54 = 0;
  for (uVar4 = 0; uVar4 != sy; uVar4 = uVar4 + 1) {
    uVar7 = ~uVar4 + sy;
    if (flip != 0) {
      uVar7 = uVar4;
    }
    iVar9 = uVar7 * pixscale * pixscale * sx * 3;
    for (uVar5 = 0; uVar5 != sx; uVar5 = uVar5 + 1) {
      uVar3 = (ulong)(uint)biomes[uVar4 * sx + (int)uVar5];
      if (uVar3 < 0x100) {
        uVar6 = biomeColors[uVar3][0];
        uVar10 = biomeColors[uVar3][1];
        uVar12 = biomeColors[uVar3][2];
      }
      else {
        uVar2 = biomes[uVar4 * sx + (int)uVar5] & 0x7f;
        uVar7 = biomeColors[uVar2][0] - 0x28;
        uVar11 = biomeColors[uVar2][1] - 0x28;
        uVar2 = biomeColors[uVar2][2] - 0x28;
        if (0xff < uVar7) {
          uVar7 = 0;
        }
        uVar6 = (uchar)uVar7;
        if (0xff < uVar11) {
          uVar11 = 0;
        }
        uVar10 = (uchar)uVar11;
        if (0xff < uVar2) {
          uVar2 = 0;
        }
        uVar12 = (uchar)uVar2;
        local_54 = 1;
      }
      iVar8 = iVar9;
      for (uVar7 = 0; uVar11 = pixscale, iVar1 = iVar8, uVar7 != pixscale; uVar7 = uVar7 + 1) {
        while (uVar11 != 0) {
          pixels[iVar1] = uVar6;
          pixels[(long)iVar1 + 1] = uVar10;
          pixels[(long)iVar1 + 2] = uVar12;
          uVar11 = uVar11 - 1;
          iVar1 = iVar1 + 3;
        }
        iVar8 = iVar8 + pixscale * 3 * sx;
      }
      iVar9 = iVar9 + pixscale * 3;
    }
  }
  return local_54;
}

Assistant:

int biomesToImage(unsigned char *pixels,
        unsigned char biomeColors[256][3], const int *biomes,
        const unsigned int sx, const unsigned int sy,
        const unsigned int pixscale, const int flip)
{
    unsigned int i, j;
    int containsInvalidBiomes = 0;

    for (j = 0; j < sy; j++)
    {
        for (i = 0; i < sx; i++)
        {
            int id = biomes[j*sx+i];
            unsigned int r, g, b;

            if (id < 0 || id >= 256)
            {
                // This may happen for some intermediate layers
                containsInvalidBiomes = 1;
                r = biomeColors[id&0x7f][0]-40; r = (r>0xff) ? 0x00 : r&0xff;
                g = biomeColors[id&0x7f][1]-40; g = (g>0xff) ? 0x00 : g&0xff;
                b = biomeColors[id&0x7f][2]-40; b = (b>0xff) ? 0x00 : b&0xff;
            }
            else
            {
                r = biomeColors[id][0];
                g = biomeColors[id][1];
                b = biomeColors[id][2];
            }

            unsigned int m, n;
            for (m = 0; m < pixscale; m++) {
                for (n = 0; n < pixscale; n++) {
                    int idx = pixscale * i + n;
                    if (flip)
                        idx += (sx * pixscale) * ((pixscale * j) + m);
                    else
                        idx += (sx * pixscale) * ((pixscale * (sy-1-j)) + m);

                    unsigned char *pix = pixels + 3*idx;
                    pix[0] = (unsigned char)r;
                    pix[1] = (unsigned char)g;
                    pix[2] = (unsigned char)b;
                }
            }
        }
    }

    return containsInvalidBiomes;
}